

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

void __thiscall bitio::bitio_stream::load_buffer(bitio_stream *this)

{
  size_t sVar1;
  bool bVar2;
  
  sVar1 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
  bVar2 = sVar1 == 0;
  if (bVar2) {
    sVar1 = this->current_buffer_length;
  }
  this->current_buffer_length = sVar1;
  this->eof = bVar2;
  this->byte_index = 0;
  return;
}

Assistant:

inline void bitio_stream::load_buffer() {
    auto tmp_len = fread(byte_buffer, 1, buffer_size, file);
    current_buffer_length = tmp_len != 0 ? tmp_len : current_buffer_length;
    eof = tmp_len == 0;
    byte_index = 0;
}